

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall
singleParticleSpectra::output_two_particle_correlation_rap(singleParticleSpectra *this)

{
  char *pcVar1;
  undefined8 uVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ofstream output_ss;
  ofstream output_os;
  ofstream output;
  ostringstream filename_os;
  ostringstream filename_ss;
  ostringstream filename;
  double local_ad8;
  double local_ad0;
  char *local_ab8;
  char local_aa8 [16];
  char *local_a98;
  filebuf local_a90 [8];
  char local_a88 [8];
  uint auStack_a80 [56];
  ios_base aiStack_9a0 [264];
  char *local_898;
  filebuf local_890 [8];
  char local_888 [8];
  uint auStack_880 [56];
  ios_base aiStack_7a0 [264];
  char *local_698;
  filebuf local_690 [8];
  undefined8 uStack_688;
  uint auStack_680 [56];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_vn2_eta12",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_pT_",4);
  poVar3 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
  poVar3 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_698,local_a98,_S_out);
  if (local_a98 != local_a88) {
    operator_delete(local_a98);
  }
  if (this->rap_type == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_698,"# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",
               0x39);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_698,"# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",0x37)
    ;
  }
  std::ios::widen((char)&local_698 + (char)*(undefined8 *)(local_698 + -0x18));
  std::ostream::put((char)local_690 + -8);
  std::ostream::flush();
  if (0 < this->N_rap) {
    lVar5 = 0;
    do {
      dVar11 = this->drap;
      dVar9 = this->rapidity_dis_min;
      dVar8 = (double)this->total_number_of_events;
      dVar10 = *(double *)
                (*(long *)&(((this->QnSP_eta12).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar5 * 8) / dVar8;
      dVar7 = *(double *)
               (*(long *)&(((this->QnSP_eta12_err).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar5 * 8) / dVar8 - dVar10 * dVar10;
      local_ad0 = 0.0;
      if (0.0 < dVar7) {
        dVar7 = dVar7 / dVar8;
        if (dVar7 < 0.0) {
          local_ad0 = sqrt(dVar7);
        }
        else {
          local_ad0 = SQRT(dVar7);
        }
      }
      *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) =
           *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)&uStack_688 + *(long *)(local_698 + -0x18)) = 0x12;
      *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18)) = 8;
      poVar3 = std::ostream::_M_insert<double>((double)(int)lVar5 * dVar11 + dVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      poVar3 = std::ostream::_M_insert<double>(dVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      poVar3 = std::ostream::_M_insert<double>(local_ad0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      poVar3 = std::ostream::_M_insert<double>(dVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      poVar3 = std::ostream::_M_insert<double>
                         (*(this->Qn2_vector_err).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start / (double)this->total_number_of_events);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      if (1 < this->order_max) {
        lVar4 = 1;
        lVar6 = 0x18;
        do {
          dVar9 = *(double *)
                   (*(long *)((long)&(((this->QnSP_eta12).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar6) + lVar5 * 8) /
                  (double)this->total_number_of_events;
          local_ad8 = 0.0;
          dVar11 = 0.0;
          if (0.0 < dVar9) {
            dVar11 = dVar9 / dVar10;
            if (dVar11 < 0.0) {
              dVar11 = sqrt(dVar11);
            }
            else {
              dVar11 = SQRT(dVar11);
            }
            dVar7 = *(double *)
                     (*(long *)((long)&(((this->QnSP_eta12_err).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar6) + lVar5 * 8) /
                    (double)this->total_number_of_events - dVar9 * dVar9;
            local_ad8 = 0.0;
            if (0.0 < dVar7) {
              dVar7 = dVar7 / (double)this->total_number_of_events;
              if (dVar7 < 0.0) {
                dVar7 = sqrt(dVar7);
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              local_ad8 = dVar7 / dVar10;
            }
          }
          *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) =
               *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) & 0xfffffefb | 0x100;
          *(undefined8 *)((long)&uStack_688 + *(long *)(local_698 + -0x18)) = 0x12;
          *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18)) = 8;
          poVar3 = std::ostream::_M_insert<double>(dVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
          poVar3 = std::ostream::_M_insert<double>(local_ad8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
          poVar3 = std::ostream::_M_insert<double>(dVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
          poVar3 = std::ostream::_M_insert<double>
                             (*(double *)
                               (*(long *)((long)&(((this->QnSP_eta12_err).
                                                                                                      
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl.super__Vector_impl_data + lVar6) +
                               lVar5 * 8) / (double)this->total_number_of_events);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
          lVar4 = lVar4 + 1;
          lVar6 = lVar6 + 0x18;
        } while (lVar4 < this->order_max);
      }
      std::ios::widen((char)*(undefined8 *)(local_698 + -0x18) + (char)&local_698);
      std::ostream::put((char)&local_698);
      std::ostream::flush();
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->N_rap);
  }
  std::ofstream::close();
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream(local_320);
    std::__cxx11::ostringstream::ostringstream(local_498);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_320,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_vn2_eta12_ss",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_pT_",4);
    poVar3 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    poVar3 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_498,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_vn2_eta12_os",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_pT_",4);
    poVar3 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    poVar3 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_a98,local_898,_S_out);
    if (local_898 != local_888) {
      operator_delete(local_898);
    }
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_898,local_ab8,_S_out);
    if (local_ab8 != local_aa8) {
      operator_delete(local_ab8);
    }
    if (this->rap_type == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_a98,"# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",
                 0x39);
      std::ios::widen((char)(ostream *)&local_a98 + (char)*(undefined8 *)(local_a98 + -0x18));
      std::ostream::put((char)&local_a98);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_898,"# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",
                 0x39);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_a98,"# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",
                 0x37);
      std::ios::widen((char)(ostream *)&local_a98 + (char)*(undefined8 *)(local_a98 + -0x18));
      std::ostream::put((char)&local_a98);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_898,"# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",
                 0x37);
    }
    std::ios::widen((char)&local_898 + (char)*(undefined8 *)(local_898 + -0x18));
    std::ostream::put((char)&local_898);
    std::ostream::flush();
    if (0 < this->N_rap) {
      lVar5 = 0;
      do {
        dVar8 = (double)(int)lVar5 * this->drap + this->rapidity_dis_min;
        dVar9 = (double)this->total_number_of_events;
        dVar7 = *(double *)
                 (*(long *)&(((this->Cn2_ss_eta12).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar5 * 8) / dVar9;
        dVar11 = *(double *)
                  (*(long *)&(((this->Cn2_ss_eta12_err).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar5 * 8) / dVar9 - dVar7 * dVar7;
        local_ad0 = 0.0;
        if (0.0 < dVar11) {
          dVar11 = dVar11 / dVar9;
          if (dVar11 < 0.0) {
            local_ad0 = sqrt(dVar11);
          }
          else {
            local_ad0 = SQRT(dVar11);
          }
        }
        *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) =
             *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) & 0xfffffefb | 0x100;
        pcVar1 = local_a88 + *(long *)(local_a98 + -0x18);
        pcVar1[0] = '\x12';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(local_a90 + *(long *)(local_a98 + -0x18)) = 8;
        poVar3 = std::ostream::_M_insert<double>(dVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(local_ad0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)&(((this->Cn2_ss_eta12_err).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data + lVar5 * 8) /
                   (double)this->total_number_of_events);
        dVar9 = (double)this->total_number_of_events;
        dVar10 = *(double *)
                  (*(long *)&(((this->Cn2_os_eta12).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar5 * 8) / dVar9;
        dVar11 = *(double *)
                  (*(long *)&(((this->Cn2_os_eta12_err).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar5 * 8) / dVar9 - dVar10 * dVar10;
        local_ad0 = 0.0;
        if (0.0 < dVar11) {
          dVar11 = dVar11 / dVar9;
          if (dVar11 < 0.0) {
            local_ad0 = sqrt(dVar11);
          }
          else {
            local_ad0 = SQRT(dVar11);
          }
        }
        *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) =
             *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) & 0xfffffefb | 0x100;
        pcVar1 = local_888 + *(long *)(local_898 + -0x18);
        pcVar1[0] = '\x12';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(local_890 + *(long *)(local_898 + -0x18)) = 8;
        poVar3 = std::ostream::_M_insert<double>(dVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(local_ad0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)&(((this->Cn2_os_eta12_err).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data + lVar5 * 8) /
                   (double)this->total_number_of_events);
        if (1 < this->order_max) {
          lVar6 = 1;
          lVar4 = 0x18;
          do {
            dVar9 = *(double *)
                     (*(long *)((long)&(((this->Cn2_ss_eta12).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar5 * 8) /
                    (double)this->total_number_of_events;
            dVar11 = 0.0;
            local_ad8 = 0.0;
            if (0.0 < dVar9) {
              dVar11 = dVar9 / dVar7;
              if (dVar11 < 0.0) {
                dVar11 = sqrt(dVar11);
              }
              else {
                dVar11 = SQRT(dVar11);
              }
              dVar8 = *(double *)
                       (*(long *)((long)&(((this->Cn2_ss_eta12_err).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar4) + lVar5 * 8) /
                      (double)this->total_number_of_events - dVar9 * dVar9;
              local_ad8 = 0.0;
              if (0.0 < dVar8) {
                dVar8 = dVar8 / (double)this->total_number_of_events;
                if (dVar8 < 0.0) {
                  dVar8 = sqrt(dVar8);
                }
                else {
                  dVar8 = SQRT(dVar8);
                }
                local_ad8 = dVar8 / dVar7;
              }
            }
            *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) =
                 *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) & 0xfffffefb | 0x100;
            pcVar1 = local_a88 + *(long *)(local_a98 + -0x18);
            pcVar1[0] = '\x12';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
            *(undefined8 *)(local_a90 + *(long *)(local_a98 + -0x18)) = 8;
            poVar3 = std::ostream::_M_insert<double>(dVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
            poVar3 = std::ostream::_M_insert<double>(local_ad8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
            poVar3 = std::ostream::_M_insert<double>(dVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
            poVar3 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (*(long *)((long)&(((this->Cn2_ss_eta12_err).
                                                                                                          
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar4) +
                                 lVar5 * 8) / (double)this->total_number_of_events);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
            dVar9 = *(double *)
                     (*(long *)((long)&(((this->Cn2_os_eta12).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar5 * 8) /
                    (double)this->total_number_of_events;
            dVar11 = 0.0;
            local_ad8 = 0.0;
            if (0.0 < dVar9) {
              dVar11 = dVar9 / dVar10;
              if (dVar11 < 0.0) {
                dVar11 = sqrt(dVar11);
              }
              else {
                dVar11 = SQRT(dVar11);
              }
              dVar8 = *(double *)
                       (*(long *)((long)&(((this->Cn2_os_eta12_err).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar4) + lVar5 * 8) /
                      (double)this->total_number_of_events - dVar9 * dVar9;
              local_ad8 = 0.0;
              if (0.0 < dVar8) {
                dVar8 = dVar8 / (double)this->total_number_of_events;
                if (dVar8 < 0.0) {
                  dVar8 = sqrt(dVar8);
                }
                else {
                  dVar8 = SQRT(dVar8);
                }
                local_ad8 = dVar8 / dVar10;
              }
            }
            *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) =
                 *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) & 0xfffffefb | 0x100;
            pcVar1 = local_888 + *(long *)(local_898 + -0x18);
            pcVar1[0] = '\x12';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
            *(undefined8 *)(local_890 + *(long *)(local_898 + -0x18)) = 8;
            poVar3 = std::ostream::_M_insert<double>(dVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
            poVar3 = std::ostream::_M_insert<double>(local_ad8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
            poVar3 = std::ostream::_M_insert<double>(dVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
            poVar3 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (*(long *)((long)&(((this->Cn2_os_eta12_err).
                                                                                                          
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar4) +
                                 lVar5 * 8) / (double)this->total_number_of_events);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
            lVar6 = lVar6 + 1;
            lVar4 = lVar4 + 0x18;
          } while (lVar6 < this->order_max);
        }
        std::ios::widen((char)*(undefined8 *)(local_a98 + -0x18) + (char)&local_a98);
        std::ostream::put((char)&local_a98);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(local_898 + -0x18) + (char)&local_898);
        std::ostream::put((char)&local_898);
        std::ostream::flush();
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->N_rap);
    }
    std::ofstream::close();
    std::ofstream::close();
    uVar2 = _log;
    pcVar1 = _VTT;
    local_898 = _VTT;
    *(undefined8 *)(local_890 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_890);
    std::ios_base::~ios_base(aiStack_7a0);
    local_a98 = pcVar1;
    *(undefined8 *)(local_a90 + *(long *)(pcVar1 + -0x18) + -8) = uVar2;
    std::filebuf::~filebuf(local_a90);
    std::ios_base::~ios_base(aiStack_9a0);
    std::__cxx11::ostringstream::~ostringstream(local_498);
    std::ios_base::~ios_base(local_428);
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
  }
  local_698 = _VTT;
  *(undefined8 *)(local_690 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_690);
  std::ios_base::~ios_base(local_5a0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void singleParticleSpectra::output_two_particle_correlation_rap() {
    ostringstream filename;
    filename << path_ << "/particle_" << particle_monval << "_vn2_eta12"
             << "_pT_" << vn_rapidity_dis_pT_min << "_"
             << vn_rapidity_dis_pT_max << ".dat";
    ofstream output(filename.str().c_str());
    if (rap_type == 0) {
        output << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
               << endl;
    } else {
        output << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
               << endl;
    }

    for (int i = 0; i < N_rap; i++) {
        double eta_local = rapidity_dis_min + i * drap;
        double num_pair = QnSP_eta12[0][i] / total_number_of_events;
        double num_pair_stdsq =
            (QnSP_eta12_err[0][i] / total_number_of_events
             - num_pair * num_pair);
        double num_pair_err = 0.0;
        if (num_pair_stdsq > 0) {
            num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
        }
        output << scientific << setw(18) << setprecision(8) << eta_local << "  "
               << num_pair << "  " << num_pair_err << "  " << num_pair << "  "
               << Qn2_vector_err[0] / total_number_of_events << "  ";
        for (int iorder = 1; iorder < order_max; iorder++) {
            double vn2_avg = 0.0;
            double vn2_err = 0.0;
            double Qn2_avg = QnSP_eta12[iorder][i] / total_number_of_events;
            if (Qn2_avg > 0.) {
                vn2_avg = sqrt(Qn2_avg / num_pair);
                double Qn2_stdsq =
                    (QnSP_eta12_err[iorder][i] / total_number_of_events
                     - Qn2_avg * Qn2_avg);
                if (Qn2_stdsq > 0) {
                    double Qn2_err = sqrt(Qn2_stdsq / total_number_of_events);
                    vn2_err = Qn2_err / num_pair;
                }
            }
            output << scientific << setw(18) << setprecision(8) << vn2_avg
                   << "  " << vn2_err << "  " << Qn2_avg << "  "
                   << QnSP_eta12_err[iorder][i] / total_number_of_events
                   << "  ";
        }
        output << endl;
    }
    output.close();

    if (flag_charge_dependence == 1) {
        ostringstream filename_ss, filename_os;
        filename_ss << path_ << "/particle_" << particle_monval
                    << "_vn2_eta12_ss"
                    << "_pT_" << vn_rapidity_dis_pT_min << "_"
                    << vn_rapidity_dis_pT_max << ".dat";
        filename_os << path_ << "/particle_" << particle_monval
                    << "_vn2_eta12_os"
                    << "_pT_" << vn_rapidity_dis_pT_min << "_"
                    << vn_rapidity_dis_pT_max << ".dat";
        ofstream output_ss(filename_ss.str().c_str());
        ofstream output_os(filename_os.str().c_str());
        if (rap_type == 0) {
            output_ss
                << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
            output_os
                << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
        } else {
            output_ss
                << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
            output_os
                << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
        }
        for (int j = 0; j < N_rap; j++) {
            double eta_local = rapidity_dis_min + j * drap;

            double num_pair_ss = Cn2_ss_eta12[0][j] / total_number_of_events;
            double num_pair_ss_stdsq =
                (Cn2_ss_eta12_err[0][j] / total_number_of_events
                 - num_pair_ss * num_pair_ss);
            double num_pair_ss_err = 0.0;
            if (num_pair_ss_stdsq > 0) {
                num_pair_ss_err =
                    (sqrt(num_pair_ss_stdsq / total_number_of_events));
            }
            output_ss << scientific << setw(18) << setprecision(8) << eta_local
                      << "  " << num_pair_ss << "  " << num_pair_ss_err << "  "
                      << num_pair_ss << "  "
                      << Cn2_ss_eta12_err[0][j] / total_number_of_events;

            double num_pair_os = Cn2_os_eta12[0][j] / total_number_of_events;
            double num_pair_os_stdsq =
                (Cn2_os_eta12_err[0][j] / total_number_of_events
                 - num_pair_os * num_pair_os);
            double num_pair_os_err = 0.0;
            if (num_pair_os_stdsq > 0) {
                num_pair_os_err =
                    (sqrt(num_pair_os_stdsq / total_number_of_events));
            }
            output_os << scientific << setw(18) << setprecision(8) << eta_local
                      << "  " << num_pair_os << "  " << num_pair_os_err << "  "
                      << num_pair_os << "  "
                      << Cn2_os_eta12_err[0][j] / total_number_of_events;

            for (int i = 1; i < order_max; i++) {
                double vn2_avg = 0.0;
                double vn2_err = 0.0;
                double Cn2_ss_avg =
                    (Cn2_ss_eta12[i][j] / total_number_of_events);
                if (Cn2_ss_avg > 0.) {
                    vn2_avg = sqrt(Cn2_ss_avg / num_pair_ss);
                    double Cn2_ss_stdsq =
                        (Cn2_ss_eta12_err[i][j] / total_number_of_events
                         - Cn2_ss_avg * Cn2_ss_avg);
                    double Cn2_ss_err = 0.0;
                    if (Cn2_ss_stdsq > 0) {
                        Cn2_ss_err =
                            sqrt(Cn2_ss_stdsq / total_number_of_events);
                        vn2_err = Cn2_ss_err / num_pair_ss;
                    }
                }
                output_ss << scientific << setw(18) << setprecision(8)
                          << vn2_avg << "  " << vn2_err << "  " << Cn2_ss_avg
                          << "  "
                          << Cn2_ss_eta12_err[i][j] / total_number_of_events
                          << "  ";

                vn2_avg = 0.0;
                vn2_err = 0.0;
                double Cn2_os_avg =
                    (Cn2_os_eta12[i][j] / total_number_of_events);
                if (Cn2_os_avg > 0.) {
                    vn2_avg = sqrt(Cn2_os_avg / num_pair_os);
                    double Cn2_os_stdsq =
                        (Cn2_os_eta12_err[i][j] / total_number_of_events
                         - Cn2_os_avg * Cn2_os_avg);
                    double Cn2_os_err = 0.0;
                    if (Cn2_os_stdsq > 0) {
                        Cn2_os_err =
                            sqrt(Cn2_os_stdsq / total_number_of_events);
                        vn2_err = Cn2_os_err / num_pair_os;
                    }
                }
                output_os << scientific << setw(18) << setprecision(8)
                          << vn2_avg << "  " << vn2_err << "  " << Cn2_os_avg
                          << "  "
                          << Cn2_os_eta12_err[i][j] / total_number_of_events
                          << "  ";
            }
            output_ss << endl;
            output_os << endl;
        }
        output_ss.close();
        output_os.close();
    }
}